

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void __thiscall
ThreadedReplayer::compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   *parents_depth,DeferredComputeInfo *info,uint32_t depth)

{
  mapped_type *pmVar1;
  int *piVar2;
  size_type sVar3;
  mapped_type *info_00;
  ulong uVar4;
  uint uVar5;
  Hash parent;
  key_type local_38;
  
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)parents_depth,&info->hash);
  uVar5 = *pmVar1;
  if (*pmVar1 <= depth) {
    uVar5 = depth;
  }
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)parents_depth,&info->hash);
  *pmVar1 = uVar5;
  if (info->info != (VkComputePipelineCreateInfo *)0x0) {
    for (piVar2 = (int *)info->info->pNext; piVar2 != (int *)0x0; piVar2 = *(int **)(piVar2 + 2)) {
      if (*piVar2 == 0x3b9f36d0) goto LAB_0014e8ba;
    }
  }
  piVar2 = (int *)0x0;
LAB_0014e8ba:
  if ((piVar2 != (int *)0x0) && (piVar2[4] != 0)) {
    uVar4 = 0;
    do {
      local_38 = *(key_type *)(*(long *)(piVar2 + 6) + uVar4 * 8);
      sVar3 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&parents->_M_h,&local_38);
      if ((sVar3 != 0) &&
         (pmVar1 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)parents_depth,&local_38), *pmVar1 <= depth)) {
        info_00 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)parents,&local_38);
        compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
                  (this,parents,parents_depth,info_00,depth + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (uint)piVar2[4]);
  }
  return;
}

Assistant:

void compute_parents_depth(const unordered_map<Hash, DerivedInfo> &parents,
	                           unordered_map<Hash, uint32_t> &parents_depth,
	                           const DerivedInfo &info, uint32_t depth)
	{
		parents_depth[info.hash] = max(parents_depth.at(info.hash), depth);

		auto library = work_item_get_library_info(info);
		if (!library)
			return;

		for (uint32_t i = 0; i < library->libraryCount; i++)
		{
			Hash parent = (Hash)library->pLibraries[i];
			if (parents.count(parent) != 0 && parents_depth.at(parent) <= depth)
				compute_parents_depth(parents, parents_depth, parents.at(parent), depth + 1);
		}
	}